

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::init(jpeg_decoder *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  uint32_t in_EDX;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar6;
  undefined1 auVar5 [16];
  int iVar7;
  undefined1 auVar8 [16];
  long lVar4;
  
  this->m_flags = in_EDX;
  lVar2 = 0;
  this->m_error_code = JPGD_SUCCESS;
  this->m_ready_flag = false;
  this->m_pMem_blocks = (mem_block *)0x0;
  this->m_image_x_size = 0;
  this->m_image_y_size = 0;
  this->m_pStream = (jpeg_decoder_stream *)ctx;
  this->m_progressive_flag = 0;
  this->m_huff_ac[0] = '\0';
  this->m_huff_ac[1] = '\0';
  this->m_huff_ac[2] = '\0';
  this->m_huff_ac[3] = '\0';
  this->m_huff_ac[4] = '\0';
  this->m_huff_ac[5] = '\0';
  this->m_huff_ac[6] = '\0';
  this->m_huff_ac[7] = '\0';
  memset(this->m_huff_num,0,0x1a4);
  memset(this->m_pHuff_tabs,0,0x94);
  this->m_pIn_buf_ofs = this->m_in_buf;
  this->m_eof_flag = false;
  this->m_sample_buf_prev_valid = false;
  this->m_total_bytes_read = 0;
  memset(&this->m_in_buf_left,0,0x2108);
  this->m_restart_interval = 0;
  this->m_restarts_left = 0;
  this->m_next_restart_num = 0;
  this->m_max_mcus_per_row = 0;
  this->m_max_blocks_per_mcu = 0;
  this->m_max_mcus_per_col = 0;
  this->m_last_dc_val[0] = 0;
  this->m_last_dc_val[1] = 0;
  this->m_last_dc_val[2] = 0;
  this->m_last_dc_val[3] = 0;
  this->m_pMCU_coefficients = (jpgd_block_t *)0x0;
  this->m_pSample_buf = (uint8 *)0x0;
  this->m_pSample_buf_prev = (uint8 *)0x0;
  this->m_pScan_line_0 = (uint8 *)0x0;
  this->m_pScan_line_1 = (uint8 *)0x0;
  prep_in_buffer(this);
  this->m_bits_left = 0x10;
  this->m_bit_buf = 0;
  get_bits(this,0x10);
  get_bits(this,0x10);
  auVar1 = _DAT_001fd370;
  auVar3 = _DAT_001fd5f0;
  do {
    auVar5 = auVar3 ^ auVar1;
    auVar8._0_4_ = -(uint)(auVar5._0_4_ < -0x7ffffff6);
    iVar6 = auVar5._4_4_;
    auVar8._4_4_ = -(uint)(iVar6 < -0x80000000);
    auVar8._8_4_ = -(uint)(auVar5._8_4_ < -0x7ffffff6);
    iVar7 = auVar5._12_4_;
    auVar8._12_4_ = -(uint)(iVar7 < -0x80000000);
    auVar5._0_4_ = -(uint)(iVar6 == -0x80000000);
    auVar5._4_4_ = -(uint)(iVar6 == -0x80000000);
    auVar5._8_4_ = -(uint)(iVar7 == -0x80000000);
    auVar5._12_4_ = -(uint)(iVar7 == -0x80000000);
    auVar5 = auVar5 & auVar8;
    if ((auVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->m_mcu_block_max_zag[lVar2] = 0x40;
    }
    if ((auVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->m_mcu_block_max_zag[lVar2 + 1] = 0x40;
    }
    lVar2 = lVar2 + 2;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
  } while (lVar2 != 10);
  return (int)auVar5._8_2_;
}

Assistant:

void jpeg_decoder::init(jpeg_decoder_stream* pStream, uint32_t flags)
	{
		m_flags = flags;
		m_pMem_blocks = nullptr;
		m_error_code = JPGD_SUCCESS;
		m_ready_flag = false;
		m_image_x_size = m_image_y_size = 0;
		m_pStream = pStream;
		m_progressive_flag = JPGD_FALSE;

		memset(m_huff_ac, 0, sizeof(m_huff_ac));
		memset(m_huff_num, 0, sizeof(m_huff_num));
		memset(m_huff_val, 0, sizeof(m_huff_val));
		memset(m_quant, 0, sizeof(m_quant));

		m_scan_type = 0;
		m_comps_in_frame = 0;

		memset(m_comp_h_samp, 0, sizeof(m_comp_h_samp));
		memset(m_comp_v_samp, 0, sizeof(m_comp_v_samp));
		memset(m_comp_quant, 0, sizeof(m_comp_quant));
		memset(m_comp_ident, 0, sizeof(m_comp_ident));
		memset(m_comp_h_blocks, 0, sizeof(m_comp_h_blocks));
		memset(m_comp_v_blocks, 0, sizeof(m_comp_v_blocks));

		m_comps_in_scan = 0;
		memset(m_comp_list, 0, sizeof(m_comp_list));
		memset(m_comp_dc_tab, 0, sizeof(m_comp_dc_tab));
		memset(m_comp_ac_tab, 0, sizeof(m_comp_ac_tab));

		m_spectral_start = 0;
		m_spectral_end = 0;
		m_successive_low = 0;
		m_successive_high = 0;
		m_max_mcu_x_size = 0;
		m_max_mcu_y_size = 0;
		m_blocks_per_mcu = 0;
		m_max_blocks_per_row = 0;
		m_mcus_per_row = 0;
		m_mcus_per_col = 0;

		memset(m_mcu_org, 0, sizeof(m_mcu_org));

		m_total_lines_left = 0;
		m_mcu_lines_left = 0;
		m_num_buffered_scanlines = 0;
		m_real_dest_bytes_per_scan_line = 0;
		m_dest_bytes_per_scan_line = 0;
		m_dest_bytes_per_pixel = 0;

		memset(m_pHuff_tabs, 0, sizeof(m_pHuff_tabs));

		memset(m_dc_coeffs, 0, sizeof(m_dc_coeffs));
		memset(m_ac_coeffs, 0, sizeof(m_ac_coeffs));
		memset(m_block_y_mcu, 0, sizeof(m_block_y_mcu));

		m_eob_run = 0;

		m_pIn_buf_ofs = m_in_buf;
		m_in_buf_left = 0;
		m_eof_flag = false;
		m_tem_flag = 0;

		memset(m_in_buf_pad_start, 0, sizeof(m_in_buf_pad_start));
		memset(m_in_buf, 0, sizeof(m_in_buf));
		memset(m_in_buf_pad_end, 0, sizeof(m_in_buf_pad_end));

		m_restart_interval = 0;
		m_restarts_left = 0;
		m_next_restart_num = 0;

		m_max_mcus_per_row = 0;
		m_max_blocks_per_mcu = 0;
		m_max_mcus_per_col = 0;

		memset(m_last_dc_val, 0, sizeof(m_last_dc_val));
		m_pMCU_coefficients = nullptr;
		m_pSample_buf = nullptr;
		m_pSample_buf_prev = nullptr;
		m_sample_buf_prev_valid = false;

		m_total_bytes_read = 0;

		m_pScan_line_0 = nullptr;
		m_pScan_line_1 = nullptr;

		// Ready the input buffer.
		prep_in_buffer();

		// Prime the bit buffer.
		m_bits_left = 16;
		m_bit_buf = 0;

		get_bits(16);
		get_bits(16);

		for (int i = 0; i < JPGD_MAX_BLOCKS_PER_MCU; i++)
			m_mcu_block_max_zag[i] = 64;
	}